

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

QStringView __thiscall
QXmlStreamAttributes::value
          (QXmlStreamAttributes *this,QAnyStringView namespaceUri,QAnyStringView name)

{
  QXmlStreamAttribute *pQVar1;
  long lVar2;
  bool bVar3;
  qsizetype qVar4;
  storage_type_conflict *psVar5;
  QXmlStreamAttribute *pQVar6;
  long lVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_78;
  ulong local_70;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_68;
  ulong local_60;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_58;
  size_t local_50;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_48;
  size_t local_40;
  long local_38;
  
  local_50 = name.m_size;
  local_58 = name.field_0;
  local_40 = namespaceUri.m_size;
  local_48 = namespaceUri.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QList<QXmlStreamAttribute>).d.ptr;
  lVar2 = (this->super_QList<QXmlStreamAttribute>).d.size;
  lVar7 = 0;
  pQVar6 = pQVar1;
  do {
    if (lVar2 * 0x68 - lVar7 == 0) {
      psVar5 = (storage_type_conflict *)0x0;
      qVar4 = 0;
LAB_0035658c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QVar8.m_data = psVar5;
        QVar8.m_size = qVar4;
        return QVar8;
      }
      __stack_chk_fail();
    }
    local_68 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(pQVar6->m_name).m_string.ptr;
    local_60 = (pQVar6->m_name).m_string.size | 0x8000000000000000;
    bVar3 = ::comparesEqual((QAnyStringView *)&local_68,(QAnyStringView *)&local_58);
    if (bVar3) {
      local_78 = *(anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)
                  ((long)&(pQVar1->m_namespaceUri).m_string.ptr + lVar7);
      local_70 = *(ulong *)((long)&(pQVar1->m_namespaceUri).m_string.size + lVar7) |
                 0x8000000000000000;
      bVar3 = ::comparesEqual((QAnyStringView *)&local_78,(QAnyStringView *)&local_48);
      if (bVar3) {
        psVar5 = *(storage_type_conflict **)((long)&(pQVar1->m_value).m_string.ptr + lVar7);
        qVar4 = *(qsizetype *)((long)&(pQVar1->m_value).m_string.size + lVar7);
        goto LAB_0035658c;
      }
    }
    pQVar6 = pQVar6 + 1;
    lVar7 = lVar7 + 0x68;
  } while( true );
}

Assistant:

QStringView QXmlStreamAttributes::value(QAnyStringView namespaceUri, QAnyStringView name) const noexcept
{
    for (const QXmlStreamAttribute &attribute : *this) {
        if (attribute.name() == name && attribute.namespaceUri() == namespaceUri)
            return attribute.value();
    }
    return QStringView();
}